

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nl-reader.h
# Opt level: O0

void __thiscall
mp::internal::
NLReader<mp::internal::BinaryReader<mp::internal::IdentityConverter>,mp::internal::NLProblemBuilder<mp::BasicProblem<mp::BasicProblemParams<int>>>>
::
ReadSuffixValues<mp::internal::NLReader<mp::internal::BinaryReader<mp::internal::IdentityConverter>,mp::internal::NLProblemBuilder<mp::BasicProblem<mp::BasicProblemParams<int>>>>::DoubleReader,mp::BasicProblem<mp::BasicProblemParams<int>>::SuffixHandler<double>>
          (NLReader<mp::internal::BinaryReader<mp::internal::IdentityConverter>,_mp::internal::NLProblemBuilder<mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>
           *this,int num_values,int num_items,SuffixHandler<double> *handler)

{
  DoubleReader *in_RCX;
  int in_ESI;
  undefined8 *in_RDI;
  int index;
  int i;
  DoubleReader read;
  undefined4 in_stack_ffffffffffffffb8;
  int in_stack_ffffffffffffffbc;
  DoubleReader *this_00;
  uint in_stack_ffffffffffffffdc;
  int iVar1;
  undefined4 in_stack_ffffffffffffffe4;
  
  for (iVar1 = 0; iVar1 < in_ESI; iVar1 = iVar1 + 1) {
    in_stack_ffffffffffffffdc =
         NLReader<mp::internal::BinaryReader<mp::internal::IdentityConverter>,_mp::internal::NLProblemBuilder<mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>
         ::ReadUInt((NLReader<mp::internal::BinaryReader<mp::internal::IdentityConverter>,_mp::internal::NLProblemBuilder<mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>
                     *)CONCAT44(in_stack_ffffffffffffffe4,iVar1),in_stack_ffffffffffffffdc);
    this_00 = in_RCX;
    NLReader<mp::internal::BinaryReader<mp::internal::IdentityConverter>,_mp::internal::NLProblemBuilder<mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>
    ::DoubleReader::operator()
              (in_RCX,(BinaryReader<mp::internal::IdentityConverter> *)
                      CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8));
    BasicProblem<mp::BasicProblemParams<int>_>::SuffixHandler<double>::SetValue
              ((SuffixHandler<double> *)this_00,in_stack_ffffffffffffffbc,7.53797932122573e-318);
    BinaryReaderBase::ReadTillEndOfLine((BinaryReaderBase *)*in_RDI);
  }
  return;
}

Assistant:

void ReadSuffixValues(int num_values, int num_items, SuffixHandler &handler) {
    ValueReader read;
    for (int i = 0; i < num_values; ++i) {
      int index = ReadUInt(num_items);
      handler.SetValue(index, read(reader_));
      reader_.ReadTillEndOfLine();
    }
  }